

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int TabItemComparerBySection(void *lhs,void *rhs)

{
  int iVar1;
  ImGuiTabItem *in_RSI;
  ImGuiTabItem *in_RDI;
  int b_section;
  int a_section;
  ImGuiTabItem *b;
  ImGuiTabItem *a;
  int local_4;
  
  local_4 = TabItemGetSectionIdx(in_RDI);
  iVar1 = TabItemGetSectionIdx(in_RSI);
  if (local_4 == iVar1) {
    local_4 = (int)in_RDI->IndexDuringLayout - (int)in_RSI->IndexDuringLayout;
  }
  else {
    local_4 = local_4 - iVar1;
  }
  return local_4;
}

Assistant:

static int IMGUI_CDECL TabItemComparerBySection(const void* lhs, const void* rhs)
{
    const ImGuiTabItem* a = (const ImGuiTabItem*)lhs;
    const ImGuiTabItem* b = (const ImGuiTabItem*)rhs;
    const int a_section = TabItemGetSectionIdx(a);
    const int b_section = TabItemGetSectionIdx(b);
    if (a_section != b_section)
        return a_section - b_section;
    return (int)(a->IndexDuringLayout - b->IndexDuringLayout);
}